

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitorTests.cpp
# Opt level: O3

void __thiscall
PrintVisitorTest_BinaryOperation_Test::TestBody(PrintVisitorTest_BinaryOperation_Test *this)

{
  ExpressionNode *pEVar1;
  ExpressionNode *pEVar2;
  BinaryOpNode *node;
  char *message;
  size_type __dnew;
  string expected;
  PrintVisitor visitor;
  stringstream result;
  AssertHelper AStack_218;
  internal local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  PrintVisitor local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1c0.stream_ = local_198;
  local_1c0.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001e93c0;
  local_1c0.indentation_ = 0;
  pEVar1 = (ExpressionNode *)operator_new(0x18);
  (pEVar1->super_Node).mark_.line = 1;
  (pEVar1->super_Node).mark_.column = 0;
  (pEVar1->super_Node)._vptr_Node = (_func_int **)&PTR__Node_001e9ac0;
  pEVar1[1].super_Node._vptr_Node = (_func_int **)0x3ff0000000000000;
  pEVar2 = (ExpressionNode *)operator_new(0x18);
  (pEVar2->super_Node).mark_.line = 1;
  (pEVar2->super_Node).mark_.column = 0;
  (pEVar2->super_Node)._vptr_Node = (_func_int **)&PTR__Node_001e9ac0;
  pEVar2[1].super_Node._vptr_Node = (_func_int **)0x4000000000000000;
  node = (BinaryOpNode *)operator_new(0x28);
  (node->super_ExpressionNode).super_Node.mark_.line = 1;
  (node->super_ExpressionNode).super_Node.mark_.column = 0;
  (node->super_ExpressionNode).super_Node._vptr_Node = (_func_int **)&PTR__BinaryOpNode_001e9c98;
  (node->leftOperand_)._M_t.
  super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
  super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
  super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl = pEVar1;
  node->operator_ = Addition;
  (node->rightOperand_)._M_t.
  super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
  super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
  super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl = pEVar2;
  PrintVisitor::visit(&local_1c0,node);
  local_200._M_dataplus._M_p = &DAT_0000003d;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_200);
  local_1e0.field_2._M_allocated_capacity = (size_type)local_200._M_dataplus._M_p;
  builtin_strncpy(local_1e0._M_dataplus._M_p,
                  "BinaryOpNode:\n NumericLiteral: 1\nAddition\n NumericLiteral: 2\n",0x3d);
  local_1e0._M_string_length = (size_type)local_200._M_dataplus._M_p;
  local_1e0._M_dataplus._M_p[(long)local_200._M_dataplus._M_p] = '\0';
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_210,"result.str()","expected",&local_200,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    if (local_208 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_208->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/tests/PrintVisitorTests.cpp"
               ,0x25,message);
    testing::internal::AssertHelper::operator=(&AStack_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&AStack_218);
    if ((long *)local_200._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_200._M_dataplus._M_p + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,(ulong)(local_1e0.field_2._M_allocated_capacity + 1))
    ;
  }
  (*(node->super_ExpressionNode).super_Node._vptr_Node[1])(node);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

TEST(PrintVisitorTest, BinaryOperation)
{
  std::stringstream result;
  PrintVisitor visitor{result};
  auto node = std::make_unique<BinaryOpNode>(std::make_unique<NumericLiteralNode>(1), BinaryOperator::Addition, std::make_unique<NumericLiteralNode>(2));
  node->accept(visitor);

  std::string expected{"BinaryOpNode:\n NumericLiteral: 1\nAddition\n NumericLiteral: 2\n"};
  EXPECT_EQ(result.str(), expected);
}